

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_printf_websocket_frame(mg_connection *nc,int op,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_168 [24];
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  int local_ac;
  undefined1 local_a8 [4];
  int len;
  va_list ap;
  char *buf;
  char mem [100];
  char *fmt_local;
  int op_local;
  mg_connection *nc_local;
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  ap[0].reg_save_area = &buf;
  ap[0].overflow_arg_area = local_168;
  ap[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_a8 = (undefined1  [4])0x18;
  local_150 = in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  unique0x1000013b = fmt;
  local_ac = mg_avprintf((char **)&ap[0].reg_save_area,100,fmt,(__va_list_tag *)local_a8);
  if (0 < local_ac) {
    mg_send_websocket_frame(nc,op,ap[0].reg_save_area,(long)local_ac);
  }
  if (((char **)ap[0].reg_save_area != &buf) && (ap[0].reg_save_area != (void *)0x0)) {
    free(ap[0].reg_save_area);
  }
  return;
}

Assistant:

void mg_printf_websocket_frame(struct mg_connection *nc, int op,
                               const char *fmt, ...) {
    char mem[MG_VPRINTF_BUFFER_SIZE], *buf = mem;
    va_list ap;
    int len;

    va_start(ap, fmt);
    if ((len = mg_avprintf(&buf, sizeof(mem), fmt, ap)) > 0) {
        mg_send_websocket_frame(nc, op, buf, len);
    }
    va_end(ap);

    if (buf != mem && buf != NULL) {
        MG_FREE(buf);
    }
}